

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O2

Var Js::AtomicsObject::ValidateSharedIntegerTypedArray
              (Var typedArray,ScriptContext *scriptContext,bool onlyInt32)

{
  ArrayBufferBase *obj;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  RecyclableObject *this;
  int32 hCode;
  Type TVar7;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    hCode = -0x7ff5e9e2;
    goto LAB_00a0374e;
  }
  if (typedArray == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a03755;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(typedArray);
  if (bVar2) {
    TVar7 = TypeIds_FirstNumberType;
  }
  else if ((ulong)typedArray >> 0x32 == 0) {
    this = UnsafeVarTo<Js::RecyclableObject>(typedArray);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a03755;
      *puVar5 = 0;
    }
    TVar7 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00a03755:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  else {
    TVar7 = TypeIds_Number;
  }
  if (onlyInt32) {
    if (TVar7 == TypeIds_Int32Array) {
LAB_00a0361c:
      pTVar6 = UnsafeVarTo<Js::TypedArrayBase>(typedArray);
      obj = (pTVar6->super_ArrayBufferParent).arrayBuffer.ptr;
      if (((obj != (ArrayBufferBase *)0x0) &&
          (bVar2 = VarIsImpl<Js::ArrayBufferBase>((RecyclableObject *)obj), bVar2)) &&
         (iVar3 = (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])(obj),
         (char)iVar3 != '\0')) {
        return obj;
      }
      hCode = -0x7ff5e9e3;
      goto LAB_00a0374e;
    }
  }
  else if ((TVar7 < TypeIds_Float32Array) && ((0x7b00000000000U >> ((ulong)TVar7 & 0x3f) & 1) != 0))
  goto LAB_00a0361c;
  hCode = -0x7ff5e9e0;
LAB_00a0374e:
  JavascriptError::ThrowTypeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

Var AtomicsObject::ValidateSharedIntegerTypedArray(Var typedArray, ScriptContext *scriptContext, bool onlyInt32)
    {
        if (!VarIs<TypedArrayBase>(typedArray))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedTypedArrayObject);
        }

        TypeId typeId = JavascriptOperators::GetTypeId(typedArray);
        if (onlyInt32)
        {
            if (typeId != TypeIds_Int32Array)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }
        else
        {
            if (!(typeId == TypeIds_Int8Array || typeId == TypeIds_Uint8Array || typeId == TypeIds_Int16Array ||
                typeId == TypeIds_Uint16Array || typeId == TypeIds_Int32Array || typeId == TypeIds_Uint32Array))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }

        TypedArrayBase *typedArrayBase = UnsafeVarTo<TypedArrayBase>(typedArray);
        ArrayBufferBase* arrayBuffer = typedArrayBase->GetArrayBuffer();
        if (arrayBuffer == nullptr || !VarIsCorrectType(arrayBuffer) || !arrayBuffer->IsSharedArrayBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        return arrayBuffer;
    }